

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

int png_inflate_read(png_structrp png_ptr,png_bytep read_buffer,uInt read_size,
                    png_uint_32p chunk_bytes,png_bytep next_out,png_alloc_size_t *out_size,
                    int finish)

{
  bool bVar1;
  int local_54;
  uint local_48;
  uInt avail;
  int ret;
  png_alloc_size_t *out_size_local;
  png_bytep next_out_local;
  png_uint_32p chunk_bytes_local;
  uInt read_size_local;
  png_bytep read_buffer_local;
  png_structrp png_ptr_local;
  
  if (png_ptr->zowner == png_ptr->chunk_name) {
    (png_ptr->zstream).next_out = next_out;
    (png_ptr->zstream).avail_out = 0;
    chunk_bytes_local._4_4_ = read_size;
    do {
      if ((png_ptr->zstream).avail_in == 0) {
        if (*chunk_bytes < chunk_bytes_local._4_4_) {
          chunk_bytes_local._4_4_ = *chunk_bytes;
        }
        *chunk_bytes = *chunk_bytes - chunk_bytes_local._4_4_;
        if (chunk_bytes_local._4_4_ != 0) {
          png_crc_read(png_ptr,read_buffer,chunk_bytes_local._4_4_);
        }
        (png_ptr->zstream).next_in = read_buffer;
        (png_ptr->zstream).avail_in = chunk_bytes_local._4_4_;
      }
      if ((png_ptr->zstream).avail_out == 0) {
        local_48 = 0xffffffff;
        if (*out_size < 0xffffffff) {
          local_48 = (uint)*out_size;
        }
        *out_size = *out_size - (ulong)local_48;
        (png_ptr->zstream).avail_out = local_48;
      }
      if (*chunk_bytes == 0) {
        local_54 = 2;
        if (finish != 0) {
          local_54 = 4;
        }
      }
      else {
        local_54 = 0;
      }
      png_ptr_local._4_4_ = png_zlib_inflate(png_ptr,local_54);
      bVar1 = false;
      if ((png_ptr_local._4_4_ == 0) && (bVar1 = true, *out_size == 0)) {
        bVar1 = (png_ptr->zstream).avail_out != 0;
      }
    } while (bVar1);
    *out_size = (ulong)(png_ptr->zstream).avail_out + *out_size;
    (png_ptr->zstream).avail_out = 0;
    png_zstream_error(png_ptr,png_ptr_local._4_4_);
  }
  else {
    (png_ptr->zstream).msg = "zstream unclaimed";
    png_ptr_local._4_4_ = -2;
  }
  return png_ptr_local._4_4_;
}

Assistant:

static int
png_inflate_read(png_structrp png_ptr, png_bytep read_buffer, uInt read_size,
    png_uint_32p chunk_bytes, png_bytep next_out, png_alloc_size_t *out_size,
    int finish)
{
   if (png_ptr->zowner == png_ptr->chunk_name)
   {
      int ret;

      /* next_in and avail_in must have been initialized by the caller. */
      png_ptr->zstream.next_out = next_out;
      png_ptr->zstream.avail_out = 0; /* set in the loop */

      do
      {
         if (png_ptr->zstream.avail_in == 0)
         {
            if (read_size > *chunk_bytes)
               read_size = (uInt)*chunk_bytes;
            *chunk_bytes -= read_size;

            if (read_size > 0)
               png_crc_read(png_ptr, read_buffer, read_size);

            png_ptr->zstream.next_in = read_buffer;
            png_ptr->zstream.avail_in = read_size;
         }

         if (png_ptr->zstream.avail_out == 0)
         {
            uInt avail = ZLIB_IO_MAX;
            if (avail > *out_size)
               avail = (uInt)*out_size;
            *out_size -= avail;

            png_ptr->zstream.avail_out = avail;
         }

         /* Use Z_SYNC_FLUSH when there is no more chunk data to ensure that all
          * the available output is produced; this allows reading of truncated
          * streams.
          */
         ret = PNG_INFLATE(png_ptr, *chunk_bytes > 0 ?
             Z_NO_FLUSH : (finish ? Z_FINISH : Z_SYNC_FLUSH));
      }
      while (ret == Z_OK && (*out_size > 0 || png_ptr->zstream.avail_out > 0));

      *out_size += png_ptr->zstream.avail_out;
      png_ptr->zstream.avail_out = 0; /* Should not be required, but is safe */

      /* Ensure the error message pointer is always set: */
      png_zstream_error(png_ptr, ret);
      return ret;
   }

   else
   {
      png_ptr->zstream.msg = PNGZ_MSG_CAST("zstream unclaimed");
      return Z_STREAM_ERROR;
   }
}